

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase229::run(TestCase229 *this)

{
  bool bVar1;
  Type *func;
  bool local_1b1;
  undefined1 *puStack_1b0;
  bool _kj_shouldLog;
  Maybe<kj::Exception> local_1a8;
  undefined1 local_38 [8];
  SchemaLoader loader;
  TestCase229 *this_local;
  
  loader.impl.value.ptr = (Impl *)this;
  SchemaLoader::SchemaLoader((SchemaLoader *)local_38);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestListDefaults>
            ((SchemaLoader *)local_38);
  puStack_1b0 = local_38;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase229::run()::__0>
            (&local_1a8,(kj *)&stack0xfffffffffffffe50,func);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_1a8,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_1a8);
  if (!bVar1) {
    local_1b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b1 != false) {
      kj::_::Debug::log<char_const(&)[153]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0xe9,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()); }) != nullptr\""
                 ,(char (*) [153])
                  "failed: expected kj::runCatchingExceptions([&]() { loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()); }) != nullptr"
                );
      local_1b1 = false;
    }
  }
  SchemaLoader::~SchemaLoader((SchemaLoader *)local_38);
  return;
}

Assistant:

TEST(SchemaLoader, Incompatible) {
  SchemaLoader loader;
  loader.loadCompiledTypeAndDependencies<test::TestListDefaults>();
  EXPECT_NONFATAL_FAILURE(
      loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()));
}